

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O3

void __thiscall tcmalloc::ThreadCache::Init(ThreadCache *this)

{
  undefined8 uVar1;
  long lVar2;
  int cl;
  long lVar3;
  
  this->size_ = 0;
  this->max_size_ = 0;
  this->prev = (ThreadCache *)0x0;
  this->next = (ThreadCache *)0x0;
  this->total_alloc_ = 0;
  this->total_free_ = 0;
  IncreaseCacheLimitLocked(this);
  lVar2 = 0;
  lVar3 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&SizeClasses + lVar2);
    *(undefined8 *)((long)&this->freelists_[0].lowater_ + lVar2 * 2) = 0x100000000;
    *(undefined4 *)((long)&this->freelists_[0].length_overages_ + lVar2 * 2) = 0;
    *(undefined8 *)((long)&this->freelists_[0].obj_bytes_ + lVar2 * 2) = uVar1;
    *(int *)((long)&this->freelists_[0].cl_ + lVar2 * 2) = (int)lVar3;
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x18;
  } while (lVar3 != 0x56);
  return;
}

Assistant:

void Init() {
        total_alloc_ = 0;
        total_free_ = 0;
        prev = nullptr;
        next = nullptr;

        size_ = 0;
        max_size_ = 0;
        IncreaseCacheLimitLocked();
        if (max_size_ < 0) {
            max_size_ = kMinThreadCacheSize;
            unclaimed_cache_space -= kMinThreadCacheSize;
        }
        for (int cl = 0; cl < kMaxClass; ++cl) {
            freelists_[cl].Init(cl, ClassSize(cl));
        }
    }